

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__stencil_target____fx_stenciltarget_common
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  ENUM__fx_surface_face_enum EVar2;
  ParserTemplateBase *this_00;
  StringHash attributeHash;
  ParserChar *buffer;
  _func_int **pp_Var3;
  IErrorHandler *pIVar4;
  _Map_pointer ppEVar5;
  long *in_RSI;
  ParserChar *in_RDI;
  bool failed_3;
  bool failed_2;
  bool failed_1;
  bool failed;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  stencil_target____fx_stenciltarget_common__AttributeData *attributeData;
  ParserChar *in_stack_00000088;
  ParserChar *in_stack_00000090;
  StringHash in_stack_00000098;
  ErrorType in_stack_000000a0;
  Severity in_stack_000000a4;
  ParserTemplateBase *in_stack_000000a8;
  undefined4 in_stack_ffffffffffffffa8;
  byte in_stack_ffffffffffffffac;
  byte in_stack_ffffffffffffffad;
  byte in_stack_ffffffffffffffae;
  byte in_stack_ffffffffffffffaf;
  ParserTemplateBase *in_stack_ffffffffffffffb0;
  _func_unsigned_long_ParserChar_ptr_bool_ptr *baseConversionFunctionPtr;
  bool *failed_00;
  bool local_1;
  
  this_00 = (ParserTemplateBase *)
            GeneratedSaxParser::ParserTemplateBase::
            newData<COLLADASaxFWL14::stencil_target____fx_stenciltarget_common__AttributeData>
                      (in_stack_ffffffffffffffb0,
                       (void **)CONCAT17(in_stack_ffffffffffffffaf,
                                         CONCAT16(in_stack_ffffffffffffffae,
                                                  CONCAT15(in_stack_ffffffffffffffad,
                                                           CONCAT14(in_stack_ffffffffffffffac,
                                                                    in_stack_ffffffffffffffa8)))));
  buffer = (ParserChar *)*in_RSI;
  if (buffer == (ParserChar *)0x0) {
LAB_0088d1b3:
    local_1 = true;
  }
  else {
    do {
      while( true ) {
        failed_00 = *(bool **)buffer;
        if (failed_00 == (bool *)0x0) goto LAB_0088d1b3;
        attributeHash = GeneratedSaxParser::Utils::calculateStringHash(failed_00);
        if (buffer + 8 == (ParserChar *)0x0) {
          return false;
        }
        baseConversionFunctionPtr = *(_func_unsigned_long_ParserChar_ptr_bool_ptr **)(buffer + 8);
        buffer = buffer + 0x10;
        if (attributeHash == 0x7400) break;
        if (attributeHash == 0x6c795) {
          EVar2 = GeneratedSaxParser::Utils::
                  toEnum<COLLADASaxFWL14::ENUM__fx_surface_face_enum,_unsigned_long,_(COLLADASaxFWL14::ENUM__fx_surface_face_enum)6>
                            (buffer,failed_00,
                             (pair<unsigned_long,_COLLADASaxFWL14::ENUM__fx_surface_face_enum> *)
                             0x6c795,baseConversionFunctionPtr);
          *(ENUM__fx_surface_face_enum *)&(this_00->super_Parser).mSaxParser = EVar2;
          if (((in_stack_ffffffffffffffae & 1) != 0) &&
             (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                (this_00,(Severity)((ulong)buffer >> 0x20),(ErrorType)buffer,
                                 (StringHash)failed_00,attributeHash,
                                 (ParserChar *)baseConversionFunctionPtr), bVar1)) {
            return false;
          }
        }
        else if (attributeHash == 0x704ac8) {
          pp_Var3 = (_func_int **)
                    GeneratedSaxParser::Utils::toUint64(in_RDI,(bool *)(__DT_RELA + 0x169b5));
          (this_00->super_Parser)._vptr_Parser = pp_Var3;
          if (((in_stack_ffffffffffffffaf & 1) != 0) &&
             (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                (this_00,(Severity)((ulong)buffer >> 0x20),(ErrorType)buffer,
                                 (StringHash)failed_00,attributeHash,
                                 (ParserChar *)baseConversionFunctionPtr), bVar1)) {
            return false;
          }
        }
        else if (attributeHash == 0x7a2f95) {
          ppEVar5 = (_Map_pointer)GeneratedSaxParser::Utils::toUint64(in_RDI,(bool *)0x7a2f95);
          (this_00->mElementDataStack).
          super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
          ._M_impl.super__Deque_impl_data._M_map = ppEVar5;
          if (((in_stack_ffffffffffffffac & 1) != 0) &&
             (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                (this_00,(Severity)((ulong)buffer >> 0x20),(ErrorType)buffer,
                                 (StringHash)failed_00,attributeHash,
                                 (ParserChar *)baseConversionFunctionPtr), bVar1)) {
            return false;
          }
        }
        else {
          bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                            (in_stack_000000a8,in_stack_000000a4,in_stack_000000a0,in_stack_00000098
                             ,in_stack_00000090,in_stack_00000088);
          if (bVar1) {
            return false;
          }
        }
      }
      pIVar4 = (IErrorHandler *)GeneratedSaxParser::Utils::toUint64(in_RDI,(bool *)0x7400);
      (this_00->super_Parser).mErrorHandler = pIVar4;
    } while (((in_stack_ffffffffffffffad & 1) == 0) ||
            (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                               (this_00,(Severity)((ulong)buffer >> 0x20),(ErrorType)buffer,
                                (StringHash)failed_00,attributeHash,
                                (ParserChar *)baseConversionFunctionPtr), !bVar1));
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__stencil_target____fx_stenciltarget_common( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__stencil_target____fx_stenciltarget_common( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

stencil_target____fx_stenciltarget_common__AttributeData* attributeData = newData<stencil_target____fx_stenciltarget_common__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_index:
    {
bool failed;
attributeData->index = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_STENCIL_TARGET,
        HASH_ATTRIBUTE_index,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_face:
    {
bool failed;
attributeData->face = Utils::toEnum<ENUM__fx_surface_face_enum, StringHash, ENUM__fx_surface_face_enum__COUNT>(attributeValue, failed, ENUM__fx_surface_face_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_STENCIL_TARGET,
        HASH_ATTRIBUTE_face,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_mip:
    {
bool failed;
attributeData->mip = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_STENCIL_TARGET,
        HASH_ATTRIBUTE_mip,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_slice:
    {
bool failed;
attributeData->slice = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_STENCIL_TARGET,
        HASH_ATTRIBUTE_slice,
        attributeValue))
{
    return false;
}

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_STENCIL_TARGET, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}